

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int clear_float_zeros(char *str)

{
  char *__s;
  size_t sVar1;
  bool bVar2;
  char *pcStack_28;
  int len;
  char *valp;
  char *dp;
  char *str_local;
  
  __s = strchr(str,0x2e);
  if (__s == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(__s);
    pcStack_28 = __s + (int)sVar1;
    while( true ) {
      pcStack_28 = pcStack_28 + -1;
      bVar2 = false;
      if ((__s + 1 < pcStack_28) && (bVar2 = true, *pcStack_28 != ' ')) {
        bVar2 = *pcStack_28 == '0';
      }
      if (!bVar2) break;
      *pcStack_28 = '\0';
    }
    if (pcStack_28 < __s + (long)(int)sVar1 + -1) {
      str_local._4_4_ = 1;
    }
    else {
      str_local._4_4_ = 0;
    }
  }
  return str_local._4_4_;
}

Assistant:

int clear_float_zeros( char * str )
{
   char * dp  = strchr(str, '.'), * valp;
   int    len;

   if( !dp ) return 0;      /* nothing to clear */

   len = strlen(dp);

   /* never clear what is just to the right of '.' */
   for( valp = dp+len-1; (valp > dp+1) && (*valp==' ' || *valp=='0'); valp-- )
       *valp = '\0';     /* clear, so we don't worry about break conditions */

   if( valp < dp + len - 1 ) return 1;
   return 0;
}